

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Logistics_Header::Decode(Logistics_Header *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  int iVar2;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Logistics_Header *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if ((uint)KVar1 + iVar2 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  stream_00 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_ReceivingEntity);
  DATA_TYPE::operator>>(stream_00,(DataTypeBase *)&this->m_SupplyingEntity);
  return;
}

Assistant:

void Logistics_Header::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LOGISTICS_HEADER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReceivingEntity
           >> KDIS_STREAM m_SupplyingEntity;
}